

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_gui.c
# Opt level: O2

void pdgui_stub_vnew(t_pd *owner,char *destination,void *key,char *fmt,...)

{
  char in_AL;
  t_gfxstub *ptVar1;
  t_symbol *s;
  t_symbol *fmt_00;
  undefined8 in_R8;
  undefined8 in_R9;
  t_gfxstub **pptVar2;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  __va_list_tag local_108;
  undefined1 local_e8 [32];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  pptVar2 = &gfxstub_list;
  local_c8 = in_R8;
  local_c0 = in_R9;
  while (ptVar1 = *pptVar2, ptVar1 != (t_gfxstub *)0x0) {
    if (ptVar1->x_key == key) {
      gfxstub_deleteforkey(key);
    }
    pptVar2 = &ptVar1->x_next;
  }
  ptVar1 = (t_gfxstub *)pd_new(gfxstub_class);
  s = gfxstub_symbol(ptVar1);
  fmt_00 = s;
  pd_bind((t_pd *)ptVar1,s);
  ptVar1->x_owner = owner;
  ptVar1->x_sym = s;
  ptVar1->x_key = key;
  ptVar1->x_next = gfxstub_list;
  gfxstub_list = ptVar1;
  _pdguistub_vamess(destination,(char *)fmt_00,s->s_name);
  local_108.reg_save_area = local_e8;
  local_108.overflow_arg_area = &args[0].overflow_arg_area;
  local_108.gp_offset = 0x20;
  local_108.fp_offset = 0x30;
  pdgui_vamess((char *)0x0,fmt,&local_108);
  pdgui_endmess();
  return;
}

Assistant:

void pdgui_stub_vnew(t_pd *owner, const char* destination, void *key, const char* fmt, ...)
{
    t_symbol*s;
    t_gfxstub *x;
    va_list args;

        /* if any exists with matching key, burn it. */
    for (x = gfxstub_list; x; x = x->x_next)
        if (x->x_key == key)
            gfxstub_deleteforkey(key);
    x = (t_gfxstub *)pd_new(gfxstub_class);
    s = gfxstub_symbol(x);
    pd_bind(&x->x_pd, s);
    x->x_owner = owner;
    x->x_sym = s;
    x->x_key = key;
    x->x_next = gfxstub_list;
    gfxstub_list = x;

    _pdguistub_vamess(destination, "s", s->s_name);
    va_start(args, fmt);
    pdgui_vamess(0, fmt, args);
    va_end(args);
    pdgui_endmess();


}